

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

ChNodeFEAxyzrot * __thiscall
chrono::fea::ChNodeFEAxyzrot::operator=(ChNodeFEAxyzrot *this,ChNodeFEAxyzrot *other)

{
  if (other != this) {
    ChNodeFEAbase::operator=(&this->super_ChNodeFEAbase,&other->super_ChNodeFEAbase);
    ChFrameMoving<double>::operator=
              ((ChFrameMoving<double> *)&(this->super_ChNodeFEAbase).field_0x18,
               (ChFrameMoving<double> *)&(other->super_ChNodeFEAbase).field_0x18);
    ChFrame<double>::operator=(&this->X0,&other->X0);
    (this->Force).m_data[0] = (other->Force).m_data[0];
    (this->Force).m_data[1] = (other->Force).m_data[1];
    (this->Force).m_data[2] = (other->Force).m_data[2];
    (this->Torque).m_data[0] = (other->Torque).m_data[0];
    (this->Torque).m_data[1] = (other->Torque).m_data[1];
    (this->Torque).m_data[2] = (other->Torque).m_data[2];
    ChVariablesBodyOwnMass::operator=(&this->variables,&other->variables);
  }
  return this;
}

Assistant:

ChNodeFEAxyzrot& ChNodeFEAxyzrot::operator=(const ChNodeFEAxyzrot& other) {
    if (&other == this)
        return *this;

    ChNodeFEAbase::operator=(other);
    ChBodyFrame::operator=(other);

    X0 = other.X0;

    Force = other.Force;
    Torque = other.Torque;

    variables = other.variables;

    return *this;
}